

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O2

bool __thiscall
covenant::CycleBreaking<covenant::Sym>::isLinearSCC
          (CycleBreaking<covenant::Sym> *this,CFG *g,vector<int,_std::allocator<int>_> *group,
          set<int,_std::less<int>,_std::allocator<int>_> *group_set)

{
  pointer pvVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  uint lhs;
  ulong uVar5;
  uint uVar6;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_48;
  
  lhs = 0;
  while( true ) {
    uVar5 = (ulong)lhs;
    uVar4 = (long)(group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    if (uVar4 <= uVar5) break;
    uVar6 = 0;
    while( true ) {
      pvVar1 = (g->prods).
               super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)&pvVar1[uVar5].
                        super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                        ._M_impl.super__Vector_impl_data;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar1[uVar5].
                                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                 ._M_impl.super__Vector_impl_data + 8) - lVar2 >> 2) <= (ulong)uVar6
         ) break;
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_48,
                 (g->rules).
                 super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *(int *)(lVar2 + (ulong)uVar6 * 4));
      bVar3 = isLLRule(this,g,lhs,(vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_48
                       ,group_set);
      if (!bVar3) {
        std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base(&local_48);
        goto LAB_001621f5;
      }
      bVar3 = isRLRule(this,g,lhs,(vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_48
                       ,group_set);
      std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base(&local_48);
      uVar6 = uVar6 + 1;
      if (!bVar3) goto LAB_001621f5;
    }
    lhs = lhs + 1;
  }
LAB_001621f5:
  return uVar4 <= uVar5;
}

Assistant:

bool isLinearSCC (const CFG &g, 
                    const vector<int> &group, 
                    const set<int>    &group_set)
  {
    for ( unsigned int vv = 0; vv < group.size(); vv++ )
    {
      for ( unsigned int ri = 0; ri < g.prods[vv].size(); ri++ )
      {
        int r = g.prods[vv][ri].rule;
        vector<EdgeSym> RHS = g.rules[r];
        if (!isLLRule(g, vv, RHS, group_set)) return false;
        if (!isRLRule(g, vv, RHS, group_set)) return false;
      }
    }
    // here all rules are either left-linear or right-linear.
    return true;
  }